

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dog.c
# Opt level: O0

void wary_dog(monst *mtmp,boolean was_dead)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  undefined4 *local_30;
  boolean quietly;
  edog *edog;
  boolean was_dead_local;
  monst *mtmp_local;
  
  mtmp->meating = 0;
  if (mtmp->mtame != '\0') {
    if ((*(uint *)&mtmp->field_0x60 >> 0x1a & 1) == 0) {
      local_30 = (undefined4 *)&mtmp->field_0x74;
    }
    else {
      local_30 = (undefined4 *)0x0;
    }
    if ((local_30 != (undefined4 *)0x0) && (local_30[7] != 0)) {
      mtmp->mhpmax = local_30[7] + mtmp->mhpmax;
      mtmp->mhp = local_30[7] + mtmp->mhp;
      local_30[7] = 0;
    }
    if ((local_30 == (undefined4 *)0x0) ||
       (((*(byte *)((long)local_30 + 0x22) & 1) != 1 && ((int)local_30[5] < 3)))) {
      iVar1 = rn2((int)mtmp->mtame);
      if (iVar1 == 0) {
        mtmp->mtame = '\0';
        *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffbfffff;
      }
    }
    else {
      mtmp->mtame = '\0';
      *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffbfffff;
      if (((-1 < (int)local_30[5]) && ((int)local_30[5] < 10)) &&
         (iVar1 = rn2(local_30[5] + 1), iVar1 == 0)) {
        *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffbfffff | 0x400000;
      }
      if (((was_dead == '\0') && ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)) {
        if ((mtmp->data->mflags1 & 0x1000) == 0) {
          pcVar2 = Monnam(mtmp);
          pcVar3 = "refuses";
          if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) != 0) {
            pcVar3 = "seems unable";
          }
          pcVar4 = body_part(1);
          pline("%s %s to look you in the %s.",pcVar2,pcVar3,pcVar4);
        }
        else {
          pcVar2 = Monnam(mtmp);
          pline("%s avoids your gaze.",pcVar2);
        }
      }
    }
    if ((mtmp->mtame == '\0') &&
       (newsym((int)mtmp->mx,(int)mtmp->my), (*(uint *)&mtmp->field_0x60 >> 0x18 & 1) != 0)) {
      m_unleash(mtmp,'\x01');
    }
    if ((local_30 != (undefined4 *)0x0) && (mtmp->mtame != '\0')) {
      local_30[6] = local_30[6] + 1;
      *(byte *)((long)local_30 + 0x22) = *(byte *)((long)local_30 + 0x22) & 0xfe;
      local_30[5] = 0;
      *(undefined1 *)((long)local_30 + 0x21) = 0xff;
      *(undefined1 *)(local_30 + 8) = 0xff;
      if ((was_dead != '\0') || ((ulong)(uint)local_30[4] < (ulong)moves + 500)) {
        local_30[4] = moves + 500;
      }
      if (was_dead != '\0') {
        *local_30 = 0;
        local_30[1] = 10000;
        local_30[3] = 0;
        local_30[2] = 5;
      }
    }
  }
  return;
}

Assistant:

void wary_dog(struct monst *mtmp, boolean was_dead)
{
    struct edog *edog;
    boolean quietly = was_dead;

    mtmp->meating = 0;
    if (!mtmp->mtame) return;
    edog = !mtmp->isminion ? EDOG(mtmp) : 0;

    /* if monster was starving when it died, undo that now */
    if (edog && edog->mhpmax_penalty) {
	mtmp->mhpmax += edog->mhpmax_penalty;
	mtmp->mhp += edog->mhpmax_penalty;	/* heal it */
	edog->mhpmax_penalty = 0;
    }

    if (edog && (edog->killed_by_u == 1 || edog->abuse > 2)) {
	mtmp->mpeaceful = mtmp->mtame = 0;
	if (edog->abuse >= 0 && edog->abuse < 10)
	    if (!rn2(edog->abuse + 1)) mtmp->mpeaceful = 1;
	if (!quietly && cansee(mtmp->mx, mtmp->my)) {
	    if (haseyes(youmonst.data)) {
		if (haseyes(mtmp->data))
			pline("%s %s to look you in the %s.",
				Monnam(mtmp),
				mtmp->mpeaceful ? "seems unable" :
					    "refuses",
				body_part(EYE));
		else 
			pline("%s avoids your gaze.",
				Monnam(mtmp));
	    }
	}
    } else {
	/* chance it goes wild anyway - Pet Semetary */
	if (!rn2(mtmp->mtame)) {
	    mtmp->mpeaceful = mtmp->mtame = 0;
	}
    }
    if (!mtmp->mtame) {
	newsym(mtmp->mx, mtmp->my);
	/* a life-saved monster might be leashed;
	   don't leave it that way if it's no longer tame */
	if (mtmp->mleashed) m_unleash(mtmp, TRUE);
    }

    /* if its still a pet, start a clean pet-slate now */
    if (edog && mtmp->mtame) {
	edog->revivals++;
	edog->killed_by_u = 0;
	edog->abuse = 0;
	edog->ogoal.x = edog->ogoal.y = -1;
	if (was_dead || edog->hungrytime < moves + 500L)
	    edog->hungrytime = moves + 500L;
	if (was_dead) {
	    edog->droptime = 0L;
	    edog->dropdist = 10000;
	    edog->whistletime = 0L;
	    edog->apport = 5;
	} /* else lifesaved, so retain current values */
    }
}